

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationGroup.cpp
# Opt level: O1

Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
* __thiscall
Corrade::Utility::ConfigurationGroup::ValueIterator::operator*
          (Pair<Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::BasicStringView<const_char>_>
           *__return_storage_ptr__,ValueIterator *this)

{
  StringView SVar1;
  StringView SVar2;
  
  SVar1 = Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::from(&this->_value->key);
  SVar2 = Containers::Implementation::
          StringViewConverter<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::from(&this->_value->value);
  (__return_storage_ptr__->_first)._data = SVar1._data;
  (__return_storage_ptr__->_first)._sizePlusFlags = SVar1._sizePlusFlags;
  (__return_storage_ptr__->_second)._data = SVar2._data;
  (__return_storage_ptr__->_second)._sizePlusFlags = SVar2._sizePlusFlags;
  return __return_storage_ptr__;
}

Assistant:

Containers::Pair<Containers::StringView, Containers::StringView> ConfigurationGroup::ValueIterator::operator*() const {
    return {_value->key, _value->value};
}